

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromBoundedZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input,int size)

{
  int iVar1;
  bool bVar2;
  CodedInputStream decoder;
  CodedInputStream local_68;
  
  local_68.buffer_ = (uint8 *)0x0;
  local_68.buffer_end_._0_6_ = 0;
  local_68.buffer_end_._6_2_ = 0;
  local_68._24_6_ = 0;
  local_68._30_8_ = 0;
  local_68.current_limit_ = 0x7fffffff;
  local_68.buffer_size_after_limit_ = 0;
  local_68.total_bytes_limit_ = 0x4000000;
  local_68.total_bytes_warning_threshold_ = 0x2000000;
  local_68.recursion_depth_ = 0;
  local_68.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_68.extension_pool_ = (DescriptorPool *)0x0;
  local_68.extension_factory_ = (MessageFactory *)0x0;
  local_68.input_ = input;
  io::CodedInputStream::Refresh(&local_68);
  io::CodedInputStream::PushLimit(&local_68,size);
  (*this->_vptr_MessageLite[4])(this);
  iVar1 = (*this->_vptr_MessageLite[8])(this,&local_68);
  if (((char)iVar1 == '\0') || (local_68.legitimate_message_end_ != true)) {
    bVar2 = false;
  }
  else {
    iVar1 = io::CodedInputStream::BytesUntilLimit(&local_68);
    bVar2 = iVar1 == 0;
  }
  io::CodedInputStream::~CodedInputStream(&local_68);
  return bVar2;
}

Assistant:

bool MessageLite::ParsePartialFromBoundedZeroCopyStream(
    io::ZeroCopyInputStream* input, int size) {
  io::CodedInputStream decoder(input);
  decoder.PushLimit(size);
  return ParsePartialFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage() &&
         decoder.BytesUntilLimit() == 0;
}